

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::to_function_name_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,TextureFunctionNameArguments *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Dim DVar2;
  SPIRType *type;
  bool bVar3;
  runtime_error *this_00;
  CompilerError *this_01;
  uint uVar4;
  byte bVar5;
  string fname;
  string local_58;
  uint32_t local_34;
  
  if (args->has_min_lod == true) {
    if ((this->options).es == true) {
      this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_01,"Sparse residency is not supported in ESSL.");
      __cxa_throw(this_01,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"GL_ARB_sparse_texture_clamp","");
    require_extension_internal(this,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  paVar1 = &local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  type = (args->base).imgtype;
  local_34 = (args->base).img.id;
  DVar2 = (type->image).dim;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  if (((((byte)(DVar2 == Cube | DVar2 == Dim2D & (type->image).arrayed) == 1) &&
       (bVar3 = Compiler::is_depth_image(&this->super_Compiler,type,local_34), bVar3)) &&
      (args->lod != 0)) && ((args->base).is_fetch == false)) {
    bVar3 = expression_is_constant_null(this,args->lod);
    bVar5 = 1;
    if (!bVar3) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (this_00,
                 "textureLod on sampler2DArrayShadow is not constant 0.0. This cannot be expressed in GLSL."
                );
      *(undefined ***)this_00 = &PTR__runtime_error_004faf50;
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    bVar5 = 0;
  }
  if (args->is_sparse_feedback == true) {
    ::std::__cxx11::string::append((char *)&local_58);
  }
  if ((args->base).is_fetch != true) {
    ::std::__cxx11::string::append((char *)&local_58);
    if ((args->base).is_gather == true) {
      ::std::__cxx11::string::append((char *)&local_58);
    }
    if (args->has_array_offsets == true) {
      ::std::__cxx11::string::append((char *)&local_58);
    }
    if ((args->base).is_proj == true) {
      ::std::__cxx11::string::append((char *)&local_58);
    }
    if ((args->has_grad | bVar5) == 1) {
      ::std::__cxx11::string::append((char *)&local_58);
    }
    if (bVar5 != 0 || args->lod == 0) goto LAB_00333f55;
  }
  ::std::__cxx11::string::append((char *)&local_58);
LAB_00333f55:
  if (args->has_offset == true) {
    ::std::__cxx11::string::append((char *)&local_58);
  }
  if (args->has_min_lod == true) {
    ::std::__cxx11::string::append((char *)&local_58);
  }
  if ((args->is_sparse_feedback != false) || (args->has_min_lod == true)) {
    ::std::__cxx11::string::append((char *)&local_58);
  }
  uVar4 = 0x81;
  if ((this->options).es != false) {
    uVar4 = 299;
  }
  if ((uVar4 < (this->options).version) || ((args->base).is_gather != false)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_58._M_dataplus._M_p,
               local_58._M_dataplus._M_p + local_58._M_string_length);
  }
  else {
    legacy_tex_op(__return_storage_ptr__,this,&local_58,type,local_34);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_function_name(const TextureFunctionNameArguments &args)
{
	if (args.has_min_lod)
	{
		if (options.es)
			SPIRV_CROSS_THROW("Sparse residency is not supported in ESSL.");
		require_extension_internal("GL_ARB_sparse_texture_clamp");
	}

	string fname;
	auto &imgtype = *args.base.imgtype;
	VariableID tex = args.base.img;

	// textureLod on sampler2DArrayShadow and samplerCubeShadow does not exist in GLSL for some reason.
	// To emulate this, we will have to use textureGrad with a constant gradient of 0.
	// The workaround will assert that the LOD is in fact constant 0, or we cannot emit correct code.
	// This happens for HLSL SampleCmpLevelZero on Texture2DArray and TextureCube.
	bool workaround_lod_array_shadow_as_grad = false;
	if (((imgtype.image.arrayed && imgtype.image.dim == Dim2D) || imgtype.image.dim == DimCube) &&
	    is_depth_image(imgtype, tex) && args.lod && !args.base.is_fetch)
	{
		if (!expression_is_constant_null(args.lod))
		{
			SPIRV_CROSS_THROW("textureLod on sampler2DArrayShadow is not constant 0.0. This cannot be "
			                  "expressed in GLSL.");
		}
		workaround_lod_array_shadow_as_grad = true;
	}

	if (args.is_sparse_feedback)
		fname += "sparse";

	if (args.base.is_fetch)
		fname += args.is_sparse_feedback ? "TexelFetch" : "texelFetch";
	else
	{
		fname += args.is_sparse_feedback ? "Texture" : "texture";

		if (args.base.is_gather)
			fname += "Gather";
		if (args.has_array_offsets)
			fname += "Offsets";
		if (args.base.is_proj)
			fname += "Proj";
		if (args.has_grad || workaround_lod_array_shadow_as_grad)
			fname += "Grad";
		if (args.lod != 0 && !workaround_lod_array_shadow_as_grad)
			fname += "Lod";
	}

	if (args.has_offset)
		fname += "Offset";

	if (args.has_min_lod)
		fname += "Clamp";

	if (args.is_sparse_feedback || args.has_min_lod)
		fname += "ARB";

	return (is_legacy() && !args.base.is_gather) ? legacy_tex_op(fname, imgtype, tex) : fname;
}